

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

string * __thiscall
absl::internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *programname)

{
  __shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ostream *poVar2;
  FlagList *pFVar3;
  __shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<absl::internal::FlagFunc> func;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar2 = std::operator<<((ostream *)&os,"sentencepiece");
  std::operator<<(poVar2,"\n\n");
  poVar2 = std::operator<<((ostream *)&os,"Usage: ");
  poVar2 = std::operator<<(poVar2,(char *)this);
  std::operator<<(poVar2," [options] files\n\n");
  pFVar3 = anon_unknown_1::GetFlagList();
  p_Var1 = &((pFVar3->
             super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var4 = &((pFVar3->
                  super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&func.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>,p_Var4
              );
    poVar2 = std::operator<<((ostream *)&os,"   --");
    poVar2 = std::operator<<(poVar2,(func.
                                     super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->name);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = std::operator<<(poVar2,(func.
                                     super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->help);
    std::operator<<(poVar2,")");
    poVar2 = std::operator<<((ostream *)&os,"  type: ");
    poVar2 = std::operator<<(poVar2,(func.
                                     super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->type);
    poVar2 = std::operator<<(poVar2," default: ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(func.
                                      super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->default_value);
    std::operator<<(poVar2,'\n');
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&func.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::operator<<((ostream *)&os,"\n\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintHelp(const char *programname) {
  std::ostringstream os;
  os << PACKAGE_STRING << "\n\n";
  os << "Usage: " << programname << " [options] files\n\n";

  for (auto func : *GetFlagList()) {
    os << "   --" << func->name << " (" << func->help << ")";
    os << "  type: " << func->type << " default: " << func->default_value
       << '\n';
  }

  os << "\n\n";

  return os.str();
}